

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  long *plVar6;
  Descriptor *this;
  undefined1 auVar7 [8];
  ImageOutput local_3a8 [3];
  undefined1 local_348 [8];
  ImageInput input;
  HumanDetector detect;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> local_200 [4];
  Mat local_1a0 [96];
  undefined1 local_140 [8];
  Mat sampleImage;
  string local_e0 [32];
  undefined1 local_c0 [8];
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> found;
  _Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> local_90;
  undefined1 local_78 [8];
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> optimized;
  undefined1 auStack_58 [8];
  ImageOutput output;
  
  poVar5 = std::operator<<((ostream *)&std::cout,"Running demo for human detection");
  std::endl<char,std::char_traits<char>>(poVar5);
  plVar6 = (long *)operator_new(8);
  *plVar6 = (long)&PTR_read_001079e0;
  this = (Descriptor *)operator_new(0xd0);
  memset(this,0,0xd0);
  Descriptor::Descriptor(this);
  HumanDetector::HumanDetector((HumanDetector *)&input.reader);
  input.reader = (IReaderWriter *)(&this->field_0x0 + *(long *)(*(long *)this + -0x20));
  cv::Mat::Mat((Mat *)local_348);
  input._88_8_ = *(long *)(*plVar6 + -0x30) + (long)plVar6;
  std::__cxx11::string::string(local_e0,argv[1],(allocator *)auStack_58);
  ImageInput::readImage((ImageInput *)local_140,(string *)local_348);
  std::__cxx11::string::~string(local_e0);
  cv::Mat::Mat((Mat *)&detect.field_0x78,(Mat *)local_140);
  HumanDetector::detectHuman
            ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)local_c0,
             (HumanDetector *)&input.reader,(Mat *)&detect.field_0x78);
  cv::Mat::~Mat((Mat *)&detect.field_0x78);
  std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::vector
            ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)
             &found.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)local_c0);
  HumanDetector::improveBoundary
            ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)local_78,
             (HumanDetector *)&input.reader,
             (vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)
             &found.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::_Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::~_Vector_base
            ((_Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)
             &found.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  auStack_58 = (undefined1  [8])0x0;
  output.boundary.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  output.boundary.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  output.boundary.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)((long)plVar6 + *(long *)(*plVar6 + -0x30));
  cv::Mat::Mat((Mat *)local_200,(Mat *)local_140);
  std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::vector
            ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)&local_90,
             (vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)local_78);
  ImageOutput::drawBoundary(local_3a8,(Mat *)auStack_58,local_200);
  cv::Mat::~Mat((Mat *)local_3a8);
  std::_Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::~_Vector_base(&local_90);
  cv::Mat::~Mat((Mat *)local_200);
  poVar5 = std::operator<<((ostream *)&std::cout,"Press any key to exit view");
  std::endl<char,std::char_traits<char>>(poVar5);
  cv::Mat::Mat(local_1a0,(Mat *)local_140);
  ImageOutput::showImage((ImageOutput *)auStack_58,local_1a0);
  cv::Mat::~Mat(local_1a0);
  cv::waitKey(0);
  poVar5 = std::operator<<((ostream *)&std::cout,"Real world coordinates of human are:");
  std::endl<char,std::char_traits<char>>(poVar5);
  optimized.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       optimized.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  for (auVar7 = local_78;
      auVar7 != (undefined1  [8])
                optimized.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
      auVar7 = (undefined1  [8])((long)auVar7 + 0x10)) {
    iVar1 = ((pointer)auVar7)->x;
    iVar2 = ((pointer)auVar7)->y;
    iVar3 = ((pointer)auVar7)->width;
    iVar4 = ((pointer)auVar7)->height;
    poVar5 = std::operator<<((ostream *)&std::cout,"(x, y) = (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar1);
    poVar5 = std::operator<<(poVar5,", ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
    poVar5 = std::operator<<(poVar5,")");
    poVar5 = std::operator<<(poVar5,"of height");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar4);
    poVar5 = std::operator<<(poVar5,"and width ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  std::_Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::~_Vector_base
            ((_Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)auStack_58);
  std::_Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::~_Vector_base
            ((_Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)local_78);
  std::_Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::~_Vector_base
            ((_Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)local_c0);
  cv::Mat::~Mat((Mat *)local_140);
  cv::Mat::~Mat((Mat *)local_348);
  HumanDetector::~HumanDetector((HumanDetector *)&input.reader);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  std::cout << "Running demo for human detection" << std::endl;
  auto readerWriter = new ReaderWriter();
  auto des = new Descriptor();
  HumanDetector detect;
  detect.setDescriptor(des);  // set actual implementation
  ImageInput input;
  input.setReader(readerWriter);  // set actual implementation
  cv::Mat sampleImage = input.readImage(argv[1]);  // take file name from user
  std::vector<cv::Rect> found = detect.detectHuman(sampleImage);
  std::vector<cv::Rect> optimized = detect.improveBoundary(found);
  ImageOutput output;
  output.setWriter(readerWriter);  // set actual implementation
  output.drawBoundary(sampleImage, optimized);
  std::cout << "Press any key to exit view" << std::endl;
  output.showImage(sampleImage);
  cv::waitKey();  // press any key to exit view
  std::cout << "Real world coordinates of human are:" << std::endl;
  for (auto i : optimized) {
    std::cout << "(x, y) = (" << i.x << ", " << i.y << ")" << "of height"
        << i.height << "and width " << i.width << std::endl;
  }
  return 0;
}